

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

int PKCS12_handle_sequence
              (CBS *sequence,pkcs12_context *ctx,
              _func_int_CBS_ptr_pkcs12_context_ptr *handle_element)

{
  int iVar1;
  int iVar2;
  CBS child;
  uint8_t *storage;
  CBS in;
  CBS element;
  CBS local_60;
  uint8_t *local_50;
  CBS local_48;
  CBS local_38;
  
  local_50 = (uint8_t *)0x0;
  iVar1 = CBS_asn1_ber_to_der(sequence,&local_48,&local_50);
  if (iVar1 == 0) {
    iVar1 = 0;
    ERR_put_error(0x13,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0xd4);
  }
  else {
    iVar1 = CBS_get_asn1(&local_48,&local_60,0x20000010);
    if ((iVar1 == 0) || (local_48.len != 0)) {
      iVar1 = 0;
      ERR_put_error(0x13,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                    ,0xda);
    }
    else {
      iVar1 = 1;
      if (local_60.len != 0) {
        do {
          iVar2 = CBS_get_asn1(&local_60,&local_38,0x20000010);
          if (iVar2 == 0) {
            ERR_put_error(0x13,0,100,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                          ,0xe1);
LAB_001953b5:
            iVar1 = 0;
            break;
          }
          iVar2 = (*handle_element)(&local_38,ctx);
          if (iVar2 == 0) goto LAB_001953b5;
        } while (local_60.len != 0);
      }
    }
    OPENSSL_free(local_50);
  }
  return iVar1;
}

Assistant:

static int PKCS12_handle_sequence(
    CBS *sequence, struct pkcs12_context *ctx,
    int (*handle_element)(CBS *cbs, struct pkcs12_context *ctx)) {
  uint8_t *storage = NULL;
  CBS in;
  int ret = 0;

  // Although a BER->DER conversion is done at the beginning of |PKCS12_parse|,
  // the ASN.1 data gets wrapped in OCTETSTRINGs and/or encrypted and the
  // conversion cannot see through those wrappings. So each time we step
  // through one we need to convert to DER again.
  if (!CBS_asn1_ber_to_der(sequence, &in, &storage)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }

  CBS child;
  if (!CBS_get_asn1(&in, &child, CBS_ASN1_SEQUENCE) || CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    goto err;
  }

  while (CBS_len(&child) > 0) {
    CBS element;
    if (!CBS_get_asn1(&child, &element, CBS_ASN1_SEQUENCE)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!handle_element(&element, ctx)) {
      goto err;
    }
  }

  ret = 1;

err:
  OPENSSL_free(storage);
  return ret;
}